

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-gram.c
# Opt level: O1

void ztparse(void *yyp,int yymajor,ztlexinf_t *yyminor)

{
  ulong uVar1;
  undefined8 *puVar2;
  ulong uVar3;
  double dVar4;
  byte bVar5;
  int iVar6;
  ztast_program_t *pzVar7;
  ztast_assignment_t *pzVar8;
  ztast_intarray_t *pzVar9;
  ztast_statement_t *pzVar10;
  ztast_intarrayinner_t *pzVar11;
  long lVar12;
  byte *pbVar13;
  byte bVar14;
  char *pcVar15;
  ulong uVar16;
  
  puVar2 = *(undefined8 **)((long)yyp + 0x10);
  bVar5 = **yyp;
  uVar1 = (long)yyp + 0x18;
  do {
    if (bVar5 < 0x17) {
      lVar12 = (ulong)"+"[bVar5] + ((ulong)(uint)yymajor & 0xff);
      pbVar13 = "\x15[\\]^\x10`\x10=\asCDEF\x03\a\x02CDE5\x0366IS\x05\x05X\x16rGH\x0f\x03\x0f\x12\x11\v\n\t\bU\x04\x04X\x16B\a6CDE\v\n\t\bVWX\x16\x0eT\x0e6M\f\x01\rT\reTed\x13d\x13\x14T\x14TJ\x06\t\b"
                + lVar12;
      if ("\x19\x1a\x1b\x1c\x1d\x1e\x1f \b\t\x1b\v\f\r\x0e\x0f\t\x11\v\f\r\x06\x0f\a\a\x12\x14\x15\x16\x17\x18\x1b\x10\x10\x1e\x0f !\"\x01\x02\x03\x04"
          [lVar12] != (uchar)yymajor) {
        pbVar13 = "RRRRRRRRRRRRRRpo_RRcbRR" + bVar5;
      }
      bVar5 = *pbVar13;
    }
    if (bVar5 < 0x55) {
      if (bVar5 < 0x52) {
        uVar3 = *yyp;
        *(ulong *)yyp = uVar3 + 0x10;
        if (*(ulong *)((long)yyp + 0x658) < uVar3 + 0x10) {
          *(ulong *)yyp = uVar3;
          if (uVar1 < uVar3) {
            *(ulong *)yyp = ((long)yyp + (0x18 - uVar3) & 0xfffffffffffffff0) + uVar3;
          }
          builtin_strncpy(*(char **)(*(long *)((long)yyp + 0x10) + 8),"parser stack overflow",0x16);
          *(long *)((long)yyp + 0x10) = *(long *)((long)yyp + 0x10);
        }
        else {
          bVar14 = bVar5 + 0x24;
          if (bVar5 < 0x17) {
            bVar14 = bVar5;
          }
          *(byte *)(uVar3 + 0x10) = bVar14;
          *(uchar *)(uVar3 + 0x11) = (uchar)yymajor;
          *(ztlexinf_t **)(uVar3 + 0x18) = yyminor;
        }
        *(int *)((long)yyp + 8) = *(int *)((long)yyp + 8) + -1;
        return;
      }
      if (bVar5 == 0x53) {
        *(long *)yyp = *yyp + -0x10;
      }
      else {
        if (*(int *)((long)yyp + 8) < 1) {
          lVar12 = *(long *)((long)yyp + 0x10);
          pcVar15 = *(char **)(lVar12 + 8);
          if (yyminor == (ztlexinf_t *)0x0) {
            builtin_strncpy(pcVar15,"syntax error",0xd);
          }
          else {
            sprintf(pcVar15,"syntax error at line %d column %d",(ulong)(uint)yyminor->line,
                    (ulong)(uint)yyminor->column);
          }
          *(long *)((long)yyp + 0x10) = lVar12;
        }
        *(undefined4 *)((long)yyp + 8) = 3;
        if (yymajor != 0) {
          return;
        }
        uVar3 = *yyp;
        if (uVar1 < uVar3) {
          *(ulong *)yyp = ((long)yyp + (0x18 - uVar3) & 0xfffffffffffffff0) + uVar3;
        }
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      return;
    }
    uVar3 = *yyp;
    uVar16 = (ulong)(bVar5 - 0x55);
    switch(uVar16) {
    case 0:
      if (uVar3 < *(ulong *)((long)yyp + 0x658)) {
        switch(uVar16) {
        case 0:
          pzVar7 = ztast_program((ztast_t *)*puVar2,(ztast_statement_t *)0x0);
          *(ztast_program_t **)(uVar3 + 0x18) = pzVar7;
          break;
        case 1:
          goto switchD_00103223_caseD_1;
        case 2:
          goto switchD_00103223_caseD_2;
        case 3:
          goto switchD_00103223_caseD_3;
        case 4:
          goto switchD_00103223_caseD_4;
        case 5:
          goto switchD_00103223_caseD_5;
        case 6:
          goto switchD_00103223_caseD_6;
        case 7:
          goto switchD_00103223_caseD_7;
        case 8:
          goto switchD_00103223_caseD_8;
        case 9:
          goto switchD_00103223_caseD_9;
        case 10:
          goto switchD_00103223_caseD_a;
        case 0xb:
          goto switchD_00103223_caseD_b;
        case 0xc:
          goto switchD_00103223_caseD_c;
        case 0xd:
          goto switchD_00103223_caseD_d;
        case 0xe:
          goto switchD_00103223_caseD_e;
        case 0xf:
          goto switchD_00103223_caseD_f;
        case 0x10:
          goto switchD_00103223_caseD_10;
        case 0x11:
          goto switchD_00103223_caseD_11;
        case 0x12:
          goto switchD_00103223_caseD_12;
        case 0x13:
          goto switchD_00103223_caseD_13;
        case 0x14:
          goto switchD_00103223_caseD_14;
        case 0x15:
          goto switchD_00103223_caseD_15;
        case 0x16:
          goto switchD_00103223_caseD_16;
        case 0x17:
          goto switchD_00103223_caseD_17;
        case 0x18:
          goto switchD_00103223_caseD_18;
        case 0x19:
          goto switchD_00103223_caseD_19;
        case 0x1a:
          goto switchD_00103223_caseD_1a;
        case 0x1b:
          goto switchD_00103223_caseD_1b;
        case 0x1c:
          goto switchD_00103223_caseD_1c;
        case 0x1d:
          goto switchD_00103223_caseD_1d;
        case 0x1e:
          goto switchD_00103223_caseD_1e;
        }
        goto switchD_00103223_default;
      }
      if (uVar1 < uVar3) {
        *(ulong *)yyp = (uVar1 - uVar3 & 0xfffffffffffffff0) + uVar3;
      }
      builtin_strncpy(*(char **)(*(long *)((long)yyp + 0x10) + 8),"parser stack overflow",0x16);
      *(long *)((long)yyp + 0x10) = *(long *)((long)yyp + 0x10);
      bVar5 = 0;
      goto LAB_00103506;
    case 1:
switchD_00103223_caseD_1:
      pzVar10 = (ztast_statement_t *)
                ztast_program((ztast_t *)*puVar2,*(ztast_statement_t **)(uVar3 + 8));
      break;
    case 2:
switchD_00103223_caseD_2:
      ztast_statement_append
                ((ztast_t *)*puVar2,*(ztast_statement_t **)(uVar3 - 8),
                 *(ztast_statement_t **)(uVar3 + 8));
      goto switchD_00103223_default;
    case 3:
switchD_00103223_caseD_3:
      pzVar10 = ztast_statement_from_assignment
                          ((ztast_t *)*puVar2,*(ztast_assignment_t **)(uVar3 + 8));
      break;
    case 4:
switchD_00103223_caseD_4:
      pzVar8 = ztast_assignment((ztast_t *)*puVar2,*(ztast_id_t **)(uVar3 - 0x28),
                                *(ztast_expr_t **)(uVar3 - 8));
      *(ztast_assignment_t **)(uVar3 - 0x28) = pzVar8;
      goto switchD_00103223_default;
    case 5:
switchD_00103223_caseD_5:
      pzVar10 = (ztast_statement_t *)
                ztast_id((ztast_t *)*puVar2,(char *)(*(long *)(uVar3 + 8) + 0xc));
      break;
    case 6:
switchD_00103223_caseD_6:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_value((ztast_t *)*puVar2,*(ztast_value_t **)(uVar3 + 8));
      break;
    case 7:
switchD_00103223_caseD_7:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_scope((ztast_t *)*puVar2,*(ztast_scope_t **)(uVar3 + 8));
      break;
    case 8:
switchD_00103223_caseD_8:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_intarray((ztast_t *)*puVar2,*(ztast_intarray_t **)(uVar3 + 8));
      break;
    case 9:
switchD_00103223_caseD_9:
      pzVar10 = (ztast_statement_t *)
                ztast_expr_from_scopearray((ztast_t *)*puVar2,*(ztast_scopearray_t **)(uVar3 + 8));
      break;
    case 10:
switchD_00103223_caseD_a:
      pzVar10 = (ztast_statement_t *)
                ztast_value_from_integer((ztast_t *)*puVar2,*(int *)(uVar3 + 8));
      break;
    case 0xb:
switchD_00103223_caseD_b:
      pzVar10 = (ztast_statement_t *)
                ztast_value_from_decimal((ztast_t *)*puVar2,*(int *)(uVar3 + 8));
      break;
    case 0xc:
switchD_00103223_caseD_c:
      pzVar10 = (ztast_statement_t *)ztast_value_nil((ztast_t *)*puVar2);
      break;
    case 0xd:
switchD_00103223_caseD_d:
      *(int *)(uVar3 - 0x18) = *(int *)(uVar3 - 0x18) + *(int *)(uVar3 + 8);
      goto switchD_00103223_default;
    case 0xe:
switchD_00103223_caseD_e:
      *(int *)(uVar3 - 0x18) = *(int *)(uVar3 - 0x18) - *(int *)(uVar3 + 8);
      goto switchD_00103223_default;
    case 0xf:
switchD_00103223_caseD_f:
      iVar6 = *(int *)(uVar3 + 8) * *(int *)(uVar3 - 0x18);
      goto LAB_00103324;
    case 0x10:
switchD_00103223_caseD_10:
      iVar6 = *(int *)(uVar3 - 0x18) / *(int *)(uVar3 + 8);
      goto LAB_00103324;
    case 0x11:
switchD_00103223_caseD_11:
      iVar6 = *(int *)(uVar3 - 8);
LAB_00103324:
      *(int *)(uVar3 - 0x18) = iVar6;
      goto switchD_00103223_default;
    case 0x12:
switchD_00103223_caseD_12:
      iVar6 = atoi((char *)(*(long *)(uVar3 + 8) + 0xc));
      goto LAB_001033b8;
    case 0x13:
switchD_00103223_caseD_13:
      pcVar15 = (char *)(*(long *)(uVar3 + 8) + 0xd);
      goto LAB_00103455;
    case 0x14:
switchD_00103223_caseD_14:
      pcVar15 = (char *)(*(long *)(uVar3 + 8) + 0xe);
LAB_00103455:
      lVar12 = strtol(pcVar15,(char **)0x0,0x10);
      *(int *)(uVar3 + 8) = (int)lVar12;
      goto switchD_00103223_default;
    case 0x15:
switchD_00103223_caseD_15:
      dVar4 = atof((char *)(*(long *)(uVar3 + 8) + 0xc));
      iVar6 = (int)(dVar4 * 100.0);
LAB_001033b8:
      *(int *)(uVar3 + 8) = iVar6;
      goto switchD_00103223_default;
    case 0x16:
switchD_00103223_caseD_16:
      pzVar9 = (ztast_intarray_t *)ztast_scope((ztast_t *)*puVar2,(ztast_statement_t *)0x0);
      goto LAB_00103475;
    case 0x17:
switchD_00103223_caseD_17:
      pzVar11 = (ztast_intarrayinner_t *)
                ztast_scope((ztast_t *)*puVar2,*(ztast_statement_t **)(uVar3 - 8));
      goto LAB_001034bf;
    case 0x18:
switchD_00103223_caseD_18:
      pzVar9 = ztast_intarray((ztast_t *)*puVar2,(ztast_intarrayinner_t *)0x0);
LAB_00103475:
      *(ztast_intarray_t **)(uVar3 - 8) = pzVar9;
      goto switchD_00103223_default;
    case 0x19:
switchD_00103223_caseD_19:
      pzVar11 = (ztast_intarrayinner_t *)
                ztast_intarray((ztast_t *)*puVar2,*(ztast_intarrayinner_t **)(uVar3 - 8));
      goto LAB_001034bf;
    case 0x1a:
switchD_00103223_caseD_1a:
      pzVar10 = (ztast_statement_t *)
                ztast_intarrayinner_append
                          ((ztast_t *)*puVar2,(ztast_intarrayinner_t *)0x0,*(int *)(uVar3 + 8));
      break;
    case 0x1b:
switchD_00103223_caseD_1b:
      pzVar11 = ztast_intarrayinner_append
                          ((ztast_t *)*puVar2,*(ztast_intarrayinner_t **)(uVar3 - 0x18),
                           *(int *)(uVar3 + 8));
      goto LAB_001034bf;
    case 0x1c:
switchD_00103223_caseD_1c:
      pzVar11 = (ztast_intarrayinner_t *)
                ztast_scopearray((ztast_t *)*puVar2,*(ztast_scopearrayinner_t **)(uVar3 - 8));
      goto LAB_001034bf;
    case 0x1d:
switchD_00103223_caseD_1d:
      pzVar10 = (ztast_statement_t *)
                ztast_scopearrayinner_append
                          ((ztast_t *)*puVar2,(ztast_scopearrayinner_t *)0x0,
                           *(ztast_scope_t **)(uVar3 + 8));
      break;
    case 0x1e:
switchD_00103223_caseD_1e:
      pzVar11 = (ztast_intarrayinner_t *)
                ztast_scopearrayinner_append
                          ((ztast_t *)*puVar2,*(ztast_scopearrayinner_t **)(uVar3 - 0x18),
                           *(ztast_scope_t **)(uVar3 + 8));
LAB_001034bf:
      *(ztast_intarrayinner_t **)(uVar3 - 0x18) = pzVar11;
    default:
      goto switchD_00103223_default;
    }
    *(ztast_statement_t **)(uVar3 + 8) = pzVar10;
switchD_00103223_default:
    bVar14 = "\x14\x14\x15\x16\x17\x18\x19\x19\x19\x19\x1a\x1a\x1a\x1e\x1e\x1e\x1e\x1e   \x1f\x1b\x1b\x1c\x1c!!\x1d\"\"\x15\x1e"
             [uVar16];
    pbVar13 = (byte *)((long)""[uVar16] * 0x10 + uVar3);
    bVar5 = "\x15[\\]^\x10`\x10=\asCDEF\x03\a\x02CDE5\x0366IS\x05\x05X\x16rGH\x0f\x03\x0f\x12\x11\v\n\t\bU\x04\x04X\x16B\a6CDE\v\n\t\bVWX\x16\x0eT\x0e6M\f\x01\rT\reTed\x13d\x13\x14T\x14TJ\x06\t\b"
            [(long)yy_reduce_ofst[*pbVar13] + (ulong)bVar14];
    *(byte **)yyp = pbVar13 + 0x10;
    pbVar13[0x10] = bVar5;
    pbVar13[0x11] = bVar14;
LAB_00103506:
    if (*yyp <= uVar1) {
      return;
    }
  } while( true );
}

Assistant:

void ztparse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  ztparseTOKENTYPE yyminor       /* The value for the token */
  ztparseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  YYACTIONTYPE yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser = (yyParser*)yyp;  /* The parser */
  ztparseCTX_FETCH
  ztparseARG_STORE

  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif

  yyact = yypParser->yytos->stateno;
#ifndef NDEBUG
  if( yyTraceFILE ){
    if( yyact < YY_MIN_REDUCE ){
      fprintf(yyTraceFILE,"%sInput '%s' in state %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact);
    }else{
      fprintf(yyTraceFILE,"%sInput '%s' with pending reduce %d\n",
              yyTracePrompt,yyTokenName[yymajor],yyact-YY_MIN_REDUCE);
    }
  }
#endif

  do{
    assert( yyact==yypParser->yytos->stateno );
    yyact = yy_find_shift_action((YYCODETYPE)yymajor,yyact);
    if( yyact >= YY_MIN_REDUCE ){
      yyact = yy_reduce(yypParser,yyact-YY_MIN_REDUCE,yymajor,
                        yyminor ztparseCTX_PARAM);
    }else if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,(YYCODETYPE)yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      break;
    }else if( yyact==YY_ACCEPT_ACTION ){
      yypParser->yytos--;
      yy_accept(yypParser);
      return;
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) > YY_MAX_SHIFTREDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
      if( yymajor==YYNOCODE ) break;
      yyact = yypParser->yytos->stateno;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      break;
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      break;
#endif
    }
  }while( yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
  }
#endif
  return;
}